

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

AliasRet aa_uref(IRIns *refa,IRIns *refb)

{
  IRIns *refb_local;
  IRIns *refa_local;
  
  if ((refa->field_1).o == (refb->field_1).o) {
    if ((refa->field_0).op1 == (refb->field_0).op1) {
      if ((refa->field_0).op2 == (refb->field_0).op2) {
        refa_local._4_4_ = ALIAS_MUST;
      }
      else {
        refa_local._4_4_ = ALIAS_NO;
      }
    }
    else if ((((refa->field_0).op2 ^ (refb->field_0).op2) & 0xff) == 0) {
      refa_local._4_4_ = ALIAS_MAY;
    }
    else {
      refa_local._4_4_ = ALIAS_NO;
    }
  }
  else {
    refa_local._4_4_ = ALIAS_NO;
  }
  return refa_local._4_4_;
}

Assistant:

static AliasRet aa_uref(IRIns *refa, IRIns *refb)
{
  if (refa->o != refb->o)
    return ALIAS_NO;  /* Different UREFx type. */
  if (refa->op1 == refb->op1) {  /* Same function. */
    if (refa->op2 == refb->op2)
      return ALIAS_MUST;  /* Same function, same upvalue idx. */
    else
      return ALIAS_NO;  /* Same function, different upvalue idx. */
  } else {  /* Different functions, check disambiguation hash values. */
    if (((refa->op2 ^ refb->op2) & 0xff))
      return ALIAS_NO;  /* Upvalues with different hash values cannot alias. */
    else
      return ALIAS_MAY;  /* No conclusion can be drawn for same hash value. */
  }
}